

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O1

bool __thiscall
sptk::StatisticsAccumulation::Run
          (StatisticsAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer
          )

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  uint uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  size_type __new_size;
  ulong uVar15;
  double dVar16;
  Row local_58;
  double local_40;
  ulong local_38;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar8 = false;
  if ((buffer != (Buffer *)0x0) &&
     (__new_size = (long)this->num_order_ + 1, bVar8 = false,
     (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size)) {
    if ((0 < this->num_statistics_order_) &&
       ((long)(buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size)) {
      std::vector<double,_std::allocator<double>_>::resize
                (&buffer->first_order_statistics_,__new_size);
    }
    if ((1 < this->num_statistics_order_) &&
       ((buffer->second_order_statistics_).num_dimension_ != (int)__new_size)) {
      SymmetricMatrix::Resize(&buffer->second_order_statistics_,(int)__new_size);
    }
    if ((this->numerically_stable_ == true) &&
       ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size)) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->delta_,__new_size);
    }
    iVar2 = buffer->zeroth_order_statistics_;
    iVar4 = iVar2 + 1;
    buffer->zeroth_order_statistics_ = iVar4;
    iVar3 = this->num_statistics_order_;
    if ((0 < iVar3) && (this->numerically_stable_ == true)) {
      pdVar10 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar5 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar10 != pdVar5) {
        pdVar6 = (buffer->first_order_statistics_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar7 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          pdVar13 = (double *)((long)pdVar10 + lVar14);
          *(double *)((long)pdVar7 + lVar14) = *pdVar13 - *(double *)((long)pdVar6 + lVar14);
          lVar14 = lVar14 + 8;
        } while (pdVar13 + 1 != pdVar5);
      }
    }
    if (1 < iVar3) {
      if (this->numerically_stable_ == false) {
        if (-1 < this->num_order_) {
          uVar12 = 0;
          do {
            uVar11 = (uint)uVar12;
            uVar15 = 0;
            if (this->diagonal_ != false) {
              uVar15 = uVar12 & 0xffffffff;
            }
            uVar9 = (uint)uVar15;
            if ((uint)uVar15 <= uVar11) {
              uVar9 = uVar11;
            }
            do {
              pdVar6 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              dVar1 = pdVar6[uVar12];
              dVar16 = pdVar6[uVar15];
              local_58._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
              local_58.matrix_ = &buffer->second_order_statistics_;
              local_58.row_ = uVar11;
              pdVar10 = SymmetricMatrix::Row::operator[](&local_58,(int)uVar15);
              *pdVar10 = dVar1 * dVar16 + *pdVar10;
              uVar15 = uVar15 + 1;
            } while (uVar9 + 1 != uVar15);
            bVar8 = (long)uVar12 < (long)this->num_order_;
            uVar12 = uVar12 + 1;
          } while (bVar8);
        }
      }
      else if (-1 < this->num_order_) {
        pdVar6 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_40 = (double)iVar2 / (double)iVar4;
        uVar12 = 0;
        do {
          uVar11 = (uint)uVar12;
          uVar15 = 0;
          if (this->diagonal_ != false) {
            uVar15 = uVar12 & 0xffffffff;
          }
          uVar9 = (uint)uVar15;
          if ((uint)uVar15 <= uVar11) {
            uVar9 = uVar11;
          }
          local_38 = (ulong)(uVar9 + 1);
          do {
            dVar16 = pdVar6[uVar12] * local_40;
            dVar1 = pdVar6[uVar15];
            local_58._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
            local_58.matrix_ = &buffer->second_order_statistics_;
            local_58.row_ = uVar11;
            pdVar10 = SymmetricMatrix::Row::operator[](&local_58,(int)uVar15);
            *pdVar10 = dVar16 * dVar1 + *pdVar10;
            uVar15 = uVar15 + 1;
          } while (local_38 != uVar15);
          bVar8 = (long)uVar12 < (long)this->num_order_;
          uVar12 = uVar12 + 1;
        } while (bVar8);
      }
    }
    bVar8 = true;
    if (0 < this->num_statistics_order_) {
      if (this->numerically_stable_ == true) {
        pdVar10 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar10 != pdVar5) {
          iVar4 = buffer->zeroth_order_statistics_;
          pdVar13 = (buffer->first_order_statistics_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar13 = *pdVar10 * (1.0 / (double)iVar4) + *pdVar13;
            pdVar10 = pdVar10 + 1;
            pdVar13 = pdVar13 + 1;
          } while (pdVar10 != pdVar5);
        }
      }
      else {
        pdVar10 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar5 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar10 != pdVar5) {
          pdVar13 = (buffer->first_order_statistics_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar13 = *pdVar10 + *pdVar13;
            pdVar10 = pdVar10 + 1;
            pdVar13 = pdVar13 + 1;
          } while (pdVar10 != pdVar5);
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool StatisticsAccumulation::Run(const std::vector<double>& data,
                                 StatisticsAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (1 <= num_statistics_order_ &&
      buffer->first_order_statistics_.size() != length) {
    buffer->first_order_statistics_.resize(length);
  }
  if (2 <= num_statistics_order_ &&
      buffer->second_order_statistics_.GetNumDimension() !=
          static_cast<int>(length)) {
    buffer->second_order_statistics_.Resize(static_cast<int>(length));
  }
  if (numerically_stable_ && buffer->delta_.size() != length) {
    buffer->delta_.resize(length);
  }

  // Accumulate 0th order statistics.
  ++(buffer->zeroth_order_statistics_);

  // Compute delta.
  if (1 <= num_statistics_order_ && numerically_stable_) {
    std::transform(data.begin(), data.end(),
                   buffer->first_order_statistics_.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  // Accumulate 2nd order statistics.
  if (2 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double n(static_cast<double>(buffer->zeroth_order_statistics_));
      const double z((n - 1) / n);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += z * delta[i] * delta[j];
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += data[i] * data[j];
        }
      }
    }
  }

  // Accumulate 1st order statistics.
  if (1 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double z(1.0 / buffer->zeroth_order_statistics_);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     buffer->first_order_statistics_.begin(),
                     buffer->first_order_statistics_.begin(),
                     [z](double d, double a) { return a + z * d; });
    } else {
      std::transform(
          data.begin(), data.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}